

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance> *this
          ,Context *context)

{
  Context **this_00;
  int *piVar1;
  float fVar2;
  uint uVar3;
  TestInstance *this_01;
  int i;
  int iVar4;
  TestInstance *pTVar5;
  TextureFormat TVar6;
  long lVar7;
  TestTextureCube *this_02;
  undefined8 *puVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Context *texture;
  undefined4 *puVar13;
  int face;
  int iVar14;
  bool bVar15;
  Vector<float,_4> res_2;
  Vector<float,_4> res_3;
  Vector<float,_4> res_1;
  Vec4 cScale;
  Vector<float,_4> res_4;
  Vec4 cBias;
  Vector<float,_4> res_6;
  TextureFormatInfo fmtInfo;
  float local_164;
  PixelBufferAccess local_148;
  Vec4 local_118;
  uint local_100;
  uint local_fc;
  Vec4 local_f8;
  float local_e8 [8];
  TestInstance *local_c8;
  TextureRenderer *local_c0;
  Vec4 local_b8;
  float local_a8 [4];
  float local_98 [6];
  RGBA local_80 [4];
  TextureFormatInfo local_70;
  
  pTVar5 = (TestInstance *)operator_new(0x288);
  pTVar5->m_context = context;
  pTVar5->_vptr_TestInstance = (_func_int **)&PTR__TextureCubeShadowTestInstance_00d32a30;
  pTVar5[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar5[1].m_context;
  local_c8 = pTVar5 + 3;
  local_c0 = (TextureRenderer *)&pTVar5[4].m_context;
  pTVar5[1].m_context = (Context *)0x0;
  pTVar5[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar5[2].m_context = (Context *)0x0;
  pTVar5[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar5[3].m_context = (Context *)0x0;
  pTVar5[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            (local_c0,context,
             (this->m_testsParameters).super_TextureCubeTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,0x1c,0x1c);
  *(undefined4 *)&pTVar5[0x28]._vptr_TestInstance = 0;
  uVar3 = *(uint *)(pTVar5[1]._vptr_TestInstance + 8);
  if (uVar3 == 0) {
    uVar9 = 0x20;
  }
  else {
    uVar9 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  TVar6 = ::vk::mapVkFormat(*(VkFormat *)(pTVar5[1]._vptr_TestInstance + 4));
  local_148.super_ConstPixelBufferAccess.m_format.order = TVar6.order;
  local_148.super_ConstPixelBufferAccess.m_format.type = TVar6.type;
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&local_148);
  iVar4 = 0x1f - uVar9;
  local_a8[0] = local_70.valueMin.m_data[0];
  local_a8[1] = local_70.valueMin.m_data[1];
  local_a8[2] = local_70.valueMin.m_data[2];
  local_a8[3] = local_70.valueMin.m_data[3];
  local_e8[4] = 0.0;
  local_e8[5] = 0.0;
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  lVar7 = 0;
  do {
    local_e8[lVar7 + 4] = local_70.valueMax.m_data[lVar7] - local_70.valueMin.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>_>_>
             *)this_00,2);
  iVar10 = 1;
  do {
    this_02 = (TestTextureCube *)operator_new(0x188);
    local_118.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar5[1]._vptr_TestInstance + 4));
    vkt::pipeline::TestTextureCube::TestTextureCube
              (this_02,(TextureFormat *)&local_118,*(int *)(pTVar5[1]._vptr_TestInstance + 8));
    local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    local_148.super_ConstPixelBufferAccess.m_format.order = (ChannelOrder)this_02;
    local_148.super_ConstPixelBufferAccess.m_format.type = (ChannelType)((ulong)this_02 >> 0x20);
    puVar8 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar8 + 1) = 0;
    *(undefined4 *)((long)puVar8 + 0xc) = 0;
    *puVar8 = &PTR__SharedPtrState_00d31b10;
    puVar8[2] = this_02;
    local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)puVar8;
    local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)((ulong)puVar8 >> 0x20);
    *(undefined4 *)(puVar8 + 1) = 1;
    *(undefined4 *)((long)puVar8 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTextureCube>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTextureCube> *)&local_148);
    if (CONCAT44(local_148.super_ConstPixelBufferAccess.m_size.m_data[1],
                 local_148.super_ConstPixelBufferAccess.m_size.m_data[0]) != 0) {
      LOCK();
      piVar1 = (int *)(CONCAT44(local_148.super_ConstPixelBufferAccess.m_size.m_data[1],
                                local_148.super_ConstPixelBufferAccess.m_size.m_data[0]) + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        local_148.super_ConstPixelBufferAccess.m_format.order = R;
        local_148.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        (**(code **)(*(long *)CONCAT44(local_148.super_ConstPixelBufferAccess.m_size.m_data[1],
                                       local_148.super_ConstPixelBufferAccess.m_size.m_data[0]) +
                    0x10))();
      }
      LOCK();
      piVar1 = (int *)(CONCAT44(local_148.super_ConstPixelBufferAccess.m_size.m_data[1],
                                local_148.super_ConstPixelBufferAccess.m_size.m_data[0]) + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((long *)CONCAT44(local_148.super_ConstPixelBufferAccess.m_size.m_data[1],
                             local_148.super_ConstPixelBufferAccess.m_size.m_data[0]) != (long *)0x0
           ) {
          (**(code **)(*(long *)CONCAT44(local_148.super_ConstPixelBufferAccess.m_size.m_data[1],
                                         local_148.super_ConstPixelBufferAccess.m_size.m_data[0]) +
                      8))();
        }
        local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      }
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  if (texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients == '\0') {
    createInstance();
  }
  uVar12 = 0;
  iVar10 = 0;
  if (0 < iVar4) {
    iVar10 = iVar4;
  }
  puVar13 = &texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
             TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
             ::gradients;
  do {
    if (uVar3 != 0) {
      iVar14 = 0;
      do {
        (*(code *)(*this_00)->m_testCtx->m_platform[7]._vptr_Platform)
                  (&local_148,(*this_00)->m_testCtx,iVar14,uVar12 & 0xffffffff);
        local_e8[0] = 0.0;
        local_e8[1] = 0.0;
        local_e8[2] = 0.0;
        local_e8[3] = 0.0;
        lVar7 = 0;
        do {
          local_e8[lVar7] = (float)puVar13[lVar7] * local_e8[lVar7 + 4];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_118.m_data[0] = 0.0;
        local_118.m_data[1] = 0.0;
        local_118.m_data[2] = 0.0;
        local_118.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          local_118.m_data[lVar7] = local_e8[lVar7] + local_a8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          local_f8.m_data[lVar7] = (float)puVar13[lVar7 + 4] * local_e8[lVar7 + 4];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_b8.m_data[0] = 0.0;
        local_b8.m_data[1] = 0.0;
        local_b8.m_data[2] = 0.0;
        local_b8.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          local_b8.m_data[lVar7] = local_f8.m_data[lVar7] + local_a8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::fillWithComponentGradients(&local_148,&local_118,&local_b8);
        bVar15 = iVar14 != iVar10;
        iVar14 = iVar14 + 1;
      } while (bVar15);
    }
    uVar12 = uVar12 + 1;
    puVar13 = puVar13 + 8;
  } while (uVar12 != 6);
  iVar14 = 0;
  do {
    if (uVar3 != 0) {
      iVar11 = 0;
      do {
        (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x38))
                  (&local_148,(*this_00)->m_progCollection,iVar11,iVar14);
        uVar9 = (0xffffff / (iVar4 * 6 + 6U)) * iVar14 * iVar11;
        local_fc = uVar9 | 0xff000000;
        tcu::RGBA::toVec((RGBA *)&local_b8);
        local_100 = ~uVar9 | 0xff000000;
        local_e8[0] = 0.0;
        local_e8[1] = 0.0;
        local_e8[2] = 0.0;
        local_e8[3] = 0.0;
        lVar7 = 0;
        do {
          local_e8[lVar7] = local_b8.m_data[lVar7] * local_e8[lVar7 + 4];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_118.m_data[0] = 0.0;
        local_118.m_data[1] = 0.0;
        local_118.m_data[2] = 0.0;
        local_118.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          local_118.m_data[lVar7] = local_e8[lVar7] + local_a8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::RGBA::toVec(local_80);
        local_98[0] = 0.0;
        local_98[1] = 0.0;
        local_98[2] = 0.0;
        local_98[3] = 0.0;
        lVar7 = 0;
        do {
          local_98[lVar7] = (float)local_80[lVar7].m_value * local_e8[lVar7 + 4];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          local_f8.m_data[lVar7] = local_98[lVar7] + local_a8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::fillWithGrid(&local_148,4,&local_118,&local_f8);
        bVar15 = iVar11 != iVar10;
        iVar11 = iVar11 + 1;
      } while (bVar15);
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 6);
  for (texture = pTVar5[1].m_context; this_01 = local_c8,
      texture != (Context *)pTVar5[2]._vptr_TestInstance;
      texture = (Context *)&texture->m_progCollection) {
    TextureRenderer::addCubeTexture(local_c0,(TestTextureCubeSp *)texture);
  }
  local_148.super_ConstPixelBufferAccess.m_format.order = R;
  local_148.super_ConstPixelBufferAccess.m_format.type = 0xbfa00000;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40666666;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f99999a;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3fa00000;
  local_164 = 0.0;
  bVar15 = *(int *)pTVar5[1]._vptr_TestInstance - 5U < 2;
  fVar2 = *(float *)(&DAT_00b559a0 + (ulong)bVar15 * 4);
  if (!bVar15) {
    local_164 = 0.5;
  }
  local_148.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)fVar2;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)local_c8,(value_type *)&local_148);
  local_148.super_ConstPixelBufferAccess.m_format.order = R;
  local_148.super_ConstPixelBufferAccess.m_format.type = 0x3f4ccccd;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f4ccccd;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3fa00000;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f99999a;
  local_148.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)local_164;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_148);
  local_148.super_ConstPixelBufferAccess.m_format.order = A;
  local_148.super_ConstPixelBufferAccess.m_format.type = 0xbf9851ec;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x4059999a;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f8ccccd;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3faccccd;
  local_148.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)fVar2;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_148);
  local_148.super_ConstPixelBufferAccess.m_format.order = A;
  local_148.super_ConstPixelBufferAccess.m_format.type = 0xbf99999a;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40733333;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40b33333;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40b33333;
  local_148.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)local_164;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_148);
  local_148.super_ConstPixelBufferAccess.m_format.order = A;
  local_148.super_ConstPixelBufferAccess.m_format.type = 0xbf1c28f6;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x42333333;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f666666;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f970a3d;
  local_148.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f8ccccd;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_148);
  local_148.super_ConstPixelBufferAccess.m_format.order = A;
  local_148.super_ConstPixelBufferAccess.m_format.type = 0xbf400000;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3d4ccccd;
  local_148.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f400000;
  local_148.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x42333333;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_148);
  return pTVar5;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}